

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

iterator __thiscall
prevector<8U,_int,_unsigned_int,_int>::insert
          (prevector<8U,_int,_unsigned_int,_int> *this,iterator pos,int *value)

{
  long lVar1;
  difference_type_conflict dVar2;
  size_type sVar3;
  size_t sVar4;
  int *piVar5;
  int *in_RDX;
  prevector<8U,_int,_unsigned_int,_int> *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int *dst;
  int *ptr;
  size_type new_size;
  size_type p;
  iterator *this_00;
  iterator in_stack_ffffffffffffff90;
  int *__src;
  iterator in_stack_ffffffffffffff98;
  prevector<8U,_int,_unsigned_int,_int> *in_stack_ffffffffffffffa8;
  size_type new_capacity;
  prevector<8U,_int,_unsigned_int,_int> *this_01;
  int *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RSI;
  begin((prevector<8U,_int,_unsigned_int,_int> *)in_stack_ffffffffffffff90.ptr);
  new_capacity = (size_type)((ulong)in_RSI >> 0x20);
  dVar2 = ::operator-(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  sVar3 = size((prevector<8U,_int,_unsigned_int,_int> *)in_stack_ffffffffffffff98.ptr);
  sVar4 = capacity((prevector<8U,_int,_unsigned_int,_int> *)in_stack_ffffffffffffff90.ptr);
  if (sVar4 < sVar3 + 1) {
    change_capacity(this_01,new_capacity);
  }
  piVar5 = item_ptr(in_stack_ffffffffffffffa8,(difference_type_conflict)((ulong)in_RDI >> 0x20));
  this_00 = (iterator *)(piVar5 + 1);
  __src = piVar5;
  sVar3 = size((prevector<8U,_int,_unsigned_int,_int> *)in_stack_ffffffffffffff98.ptr);
  memmove(this_00,__src,(ulong)(sVar3 - dVar2) << 2);
  *(int *)(in_RDI + 0x20) = *(int *)(in_RDI + 0x20) + 1;
  *piVar5 = *in_RDX;
  iterator::iterator(this_00,(int *)0x924662);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_10;
  }
  __stack_chk_fail();
}

Assistant:

iterator insert(iterator pos, const T& value) {
        size_type p = pos - begin();
        size_type new_size = size() + 1;
        if (capacity() < new_size) {
            change_capacity(new_size + (new_size >> 1));
        }
        T* ptr = item_ptr(p);
        T* dst = ptr + 1;
        memmove(dst, ptr, (size() - p) * sizeof(T));
        _size++;
        new(static_cast<void*>(ptr)) T(value);
        return iterator(ptr);
    }